

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PullStrengthSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PullStrengthSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2)

{
  Token openParen;
  Token strength;
  Token closeParen;
  PullStrengthSyntax *this_00;
  Token *args_local_2;
  Token *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (PullStrengthSyntax *)allocate(this,0x40,8);
  openParen.kind = args->kind;
  openParen._2_1_ = args->field_0x2;
  openParen.numFlags.raw = (args->numFlags).raw;
  openParen.rawLen = args->rawLen;
  openParen.info = args->info;
  strength.kind = args_1->kind;
  strength._2_1_ = args_1->field_0x2;
  strength.numFlags.raw = (args_1->numFlags).raw;
  strength.rawLen = args_1->rawLen;
  strength.info = args_1->info;
  closeParen.kind = args_2->kind;
  closeParen._2_1_ = args_2->field_0x2;
  closeParen.numFlags.raw = (args_2->numFlags).raw;
  closeParen.rawLen = args_2->rawLen;
  closeParen.info = args_2->info;
  slang::syntax::PullStrengthSyntax::PullStrengthSyntax(this_00,openParen,strength,closeParen);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }